

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O3

quint32 __thiscall
HPack::FieldLookupTable::indexOf(FieldLookupTable *this,QByteArray *name,QByteArray *value)

{
  QByteArray *lhs;
  bool bVar1;
  const_iterator lhs_00;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  quint32 qVar5;
  long in_FS_OFFSET;
  SearchEntry local_88;
  HeaderField local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  staticPart();
  local_68.name.d.d = (name->d).d;
  local_68.name.d.ptr = (name->d).ptr;
  local_68.name.d.size = (name->d).size;
  if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_68.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.value.d.d = (value->d).d;
  local_68.value.d.ptr = (value->d).ptr;
  local_68.value.d.size = (value->d).size;
  if (&(local_68.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_68.value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lhs_00 = findInStaticPart(&local_68,nameAndValue);
  if (lhs_00._M_current !=
      staticPart::table.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ::operator==(&(lhs_00._M_current)->name,name);
    if (bVar1) {
      bVar1 = ::operator==(&(lhs_00._M_current)->value,value);
      if (bVar1) {
        qVar5 = (int)((ulong)((long)lhs_00._M_current -
                             (long)staticPart::table.
                                   super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 +
                1;
        goto LAB_001df06c;
      }
    }
  }
  if (this->useIndex == false) {
    indexOf();
  }
  else {
    local_88.chunk = (Chunk *)0x0;
    local_88.offset = 0;
    local_88._20_4_ = 0xaaaaaaaa;
    p_Var3 = (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    qVar5 = 0;
    local_88.field = &local_68;
    local_88.table = this;
    if (p_Var3 == (_Base_ptr)0x0) goto LAB_001df06c;
    p_Var2 = &(this->searchIndex)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var2->_M_header;
    do {
      bVar1 = SearchEntry::operator<((SearchEntry *)(p_Var3 + 1),&local_88);
      if (!bVar1) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var4 != p_Var2) {
      lhs = *(QByteArray **)(p_Var4 + 1);
      bVar1 = ::operator==(lhs,name);
      if (bVar1) {
        bVar1 = ::operator==(lhs + 1,value);
        qVar5 = 0;
        if (bVar1) {
          qVar5 = keyToIndex(this,(SearchEntry *)(p_Var4 + 1));
        }
        goto LAB_001df06c;
      }
    }
  }
  qVar5 = 0;
LAB_001df06c:
  if (&(local_68.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.value.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

quint32 FieldLookupTable::indexOf(const QByteArray &name, const QByteArray &value)const
{
    // Start from the static part first:
    const auto &table = staticPart();
    const HeaderField field(name, value);
    const auto staticPos = findInStaticPart(field, CompareMode::nameAndValue);
    if (staticPos != table.end()) {
        if (staticPos->name == name && staticPos->value == value)
            return quint32(staticPos - table.begin() + 1);
    }

    // Now we have to lookup in our dynamic part ...
    if (!useIndex) {
        qCritical("lookup in dynamic table requires search index enabled");
        return 0;
    }

    const SearchEntry key(&field, nullptr, 0, this);
    const auto pos = searchIndex.lower_bound(key);
    if (pos != searchIndex.end()) {
        const HeaderField &found = *pos->field;
        if (found.name == name && found.value == value)
            return keyToIndex(*pos);
    }

    return 0;
}